

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

optional<Range> * __thiscall
TextBuffer::Layer::find_in_range
          (optional<Range> *__return_storage_ptr__,Layer *this,Regex *regex,Range range,bool splay)

{
  Range range_00;
  optional<Range> *result;
  anon_class_8_1_6971b95b local_48;
  Layer *local_3c;
  Point local_34;
  byte local_29;
  Regex *pRStack_28;
  bool splay_local;
  Regex *regex_local;
  Layer *this_local;
  Range range_local;
  
  range_local.start = range.end;
  this_local = (Layer *)range.start;
  local_29 = splay;
  pRStack_28 = regex;
  regex_local = (Regex *)this;
  optional<Range>::optional(__return_storage_ptr__);
  local_3c = this_local;
  local_34 = range_local.start;
  range_00.end = range_local.start;
  range_00.start = (Point)this_local;
  local_48.result = __return_storage_ptr__;
  scan_in_range<TextBuffer::Layer::find_in_range(Regex_const&,Range,bool)::_lambda(Range)_1_>
            (this,pRStack_28,range_00,&local_48,(bool)(local_29 & 1));
  return __return_storage_ptr__;
}

Assistant:

optional<Range> find_in_range(const Regex &regex, Range range, bool splay = false) {
    optional<Range> result;
    scan_in_range(regex, range, [&result](Range match_range) -> bool {
      result = match_range;
      return true;
    }, splay);
    return result;
  }